

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O1

int Pdr_SetContains(Pdr_Set_t *pOld,Pdr_Set_t *pNew)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  iVar1 = pOld->nLits;
  if ((long)iVar1 < 1) {
    __assert_fail("pOld->nLits > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrUtil.c"
                  ,0x132,"int Pdr_SetContains(Pdr_Set_t *, Pdr_Set_t *)");
  }
  iVar2 = pNew->nLits;
  if ((long)iVar2 < 1) {
    __assert_fail("pNew->nLits > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrUtil.c"
                  ,0x133,"int Pdr_SetContains(Pdr_Set_t *, Pdr_Set_t *)");
  }
  iVar3 = 0;
  if ((iVar2 <= iVar1) && (iVar3 = 0, (pNew->Sign & ~pOld->Sign) == 0)) {
    lVar4 = (long)iVar2 * 4 + 0x10;
    lVar5 = (long)iVar1 * 4 + 0x10;
    do {
      if (lVar5 < 0x14) {
        return 0;
      }
      iVar1 = *(int *)((long)&pNew->Sign + lVar4);
      if (iVar1 == -1) {
        __assert_fail("*pNewInt != -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrUtil.c"
                      ,0x13e,"int Pdr_SetContains(Pdr_Set_t *, Pdr_Set_t *)");
      }
      iVar2 = *(int *)((long)&pOld->Sign + lVar5);
      if (iVar2 == -1) {
        __assert_fail("*pOldInt != -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrUtil.c"
                      ,0x13f,"int Pdr_SetContains(Pdr_Set_t *, Pdr_Set_t *)");
      }
      if (iVar1 == iVar2) {
        lVar4 = lVar4 + -4;
      }
      else if (iVar2 <= iVar1) {
        return 0;
      }
      lVar5 = lVar5 + -4;
    } while (0x13 < lVar4);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int Pdr_SetContains( Pdr_Set_t * pOld, Pdr_Set_t * pNew )
{
    int * pOldInt, * pNewInt;
    assert( pOld->nLits > 0 );
    assert( pNew->nLits > 0 );
    if ( pOld->nLits < pNew->nLits )
        return 0;
    if ( (pOld->Sign & pNew->Sign) != pNew->Sign )
        return 0;
    pOldInt = pOld->Lits + pOld->nLits - 1;
    pNewInt = pNew->Lits + pNew->nLits - 1;
    while ( pNew->Lits <= pNewInt )
    {
        if ( pOld->Lits > pOldInt )
            return 0;
        assert( *pNewInt != -1 );
        assert( *pOldInt != -1 );
        if ( *pNewInt == *pOldInt )
            pNewInt--, pOldInt--;
        else if ( *pNewInt < *pOldInt )
            pOldInt--;
        else
            return 0;
    }
    return 1;
}